

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

Antecedent __thiscall
Clasp::Solver::ccHasReverseArc(Solver *this,Literal p,uint32 maxLevel,uint32 maxNew)

{
  ClauseHead *pCVar1;
  bool bVar2;
  uint32 uVar3;
  uint32 uVar4;
  Literal LVar5;
  uint uVar6;
  left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *this_00;
  left_iterator pCVar7;
  left_iterator pCVar8;
  uint in_ECX;
  uint in_EDX;
  uint32 in_ESI;
  long in_RDI;
  left_iterator end;
  left_iterator it;
  WatchList *wl;
  Antecedent ante;
  ShortImplicationsGraph *btig;
  Literal *in_stack_ffffffffffffff88;
  Antecedent *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  uint32 maxLev;
  Solver *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 local_30;
  Literal in_stack_ffffffffffffffd4;
  Literal local_c;
  Antecedent local_8;
  
  maxLev = (uint32)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
  local_c.rep_ = in_ESI;
  SharedContext::shortImplications(*(SharedContext **)(in_RDI + 0x68));
  Antecedent::Antecedent((Antecedent *)&local_30);
  uVar3 = Literal::id(&local_c);
  uVar4 = ShortImplicationsGraph::size((ShortImplicationsGraph *)0x1ee31f);
  if ((uVar3 < uVar4) &&
     (bVar2 = ShortImplicationsGraph::reverseArc
                        ((ShortImplicationsGraph *)CONCAT44(local_c.rep_,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffd4,maxLev,
                         in_stack_ffffffffffffffb0), bVar2)) {
    local_8.data_ = CONCAT44(in_stack_ffffffffffffffd4.rep_,local_30);
  }
  else {
    uVar3 = Literal::id(&local_c);
    this_00 = (left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)
              bk_lib::
              pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
              ::operator[]((pod_vector<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>,_std::allocator<bk_lib::left_right_sequence<Clasp::ClauseWatch,_Clasp::GenericWatch,_0U>_>_>
                            *)(in_RDI + 0x170),uVar3);
    pCVar7 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_begin
                       ((left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch> *)0x1ee397);
    pCVar8 = bk_lib::detail::left_right_rep<Clasp::ClauseWatch,_Clasp::GenericWatch>::left_end
                       (this_00);
    for (; pCVar7 != pCVar8; pCVar7 = pCVar7 + 1) {
      pCVar1 = pCVar7->head;
      LVar5 = Literal::operator~(in_stack_ffffffffffffff88);
      uVar6 = (*(pCVar1->super_Constraint)._vptr_Constraint[0x15])
                        (pCVar1,in_RDI,(ulong)LVar5.rep_,(ulong)in_EDX,(ulong)in_ECX);
      if ((uVar6 & 1) != 0) {
        Antecedent::Antecedent(&local_8,&pCVar7->head->super_Constraint);
        return (Antecedent)local_8.data_;
      }
    }
    local_8.data_ = CONCAT44(in_stack_ffffffffffffffd4.rep_,local_30);
  }
  return (Antecedent)local_8.data_;
}

Assistant:

Antecedent Solver::ccHasReverseArc(Literal p, uint32 maxLevel, uint32 maxNew) {
	assert(seen(p.var()) && isFalse(p) && level(p.var()) == maxLevel);
	const ShortImplicationsGraph& btig = shared_->shortImplications();
	Antecedent ante;
	if (p.id() < btig.size() && btig.reverseArc(*this, p, maxLevel, ante)) { return ante; }
	WatchList& wl = watches_[p.id()];
	for (WatchList::left_iterator it = wl.left_begin(), end = wl.left_end();  it != end;  ++it) {
		if (it->head->isReverseReason(*this, ~p, maxLevel, maxNew)) {
			return it->head;
		}
	}
	return ante;
}